

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall
setup::info::load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  bool bVar1;
  logger *this_00;
  long lVar2;
  undefined8 *puVar3;
  runtime_error *this_01;
  _Base_bitset<1UL> entries_00;
  ostringstream oss;
  string local_1e0 [32];
  undefined1 local_1c0 [400];
  
  version::load(&this->version,is);
  if ((this->version).known == false) {
    if (((uint)entries._flags.super__Base_bitset<1UL>._M_w >> 0x14 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"Unexpected setup data version: ",0x1f);
      setup::operator<<((ostream *)local_1c0,&this->version);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,local_1e0);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1c0._0_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c0 + 8),"Unexpected setup data version: ",0x1f);
    this_00 = logger::operator<<((logger *)local_1c0,(shell_command *)&color::white);
    setup::operator<<((ostream *)&this_00->buffer,&this->version);
    logger::operator<<(this_00,(shell_command *)&color::reset);
    logger::~logger((logger *)local_1c0);
  }
  if ((this->version).known == true) {
    version::is_ambiguous(&this->version);
  }
  bVar1 = version::is_ambiguous(&this->version);
  entries_00._M_w = (ulong)entries._flags.super__Base_bitset<1UL>._M_w | 0x80000;
  if (!bVar1) {
    entries_00._M_w = (_WordT)entries._flags.super__Base_bitset<1UL>._M_w;
  }
  std::istream::tellg();
  warning_suppressor::warning_suppressor((warning_suppressor *)local_1c0);
  try_load(this,is,(entry_types)entries_00._M_w,force_codepage);
  lVar2 = std::ostream::tellp();
  if (lVar2 != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::runtime_error::runtime_error;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  warning_suppressor::flush((warning_suppressor *)local_1c0);
  warning_suppressor::~warning_suppressor((warning_suppressor *)local_1c0);
  return;
}

Assistant:

void info::load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	version.load(is);
	
	if(!version.known) {
		if(entries & NoUnknownVersion) {
			std::ostringstream oss;
			oss << "Unexpected setup data version: " << version;
			throw std::runtime_error(oss.str());
		}
		log_warning << "Unexpected setup data version: "
		            << color::white << version << color::reset;
	}
	
	version_constant listed_version = version.value;
	
	// Some setup versions didn't increment the data version number when they should have.
	// To work around this, we try to parse the headers for all data versions and use the first
	// version that parses without warnings or errors.
	bool ambiguous = !version.known || version.is_ambiguous();
	if(version.is_ambiguous()) {
		// Force parsing all headers so that we don't miss any errors.
		entries |= NoSkip;
	}
	
	bool parsed_without_errors = false;
	std::streampos start = is.tellg();
	for(;;) {
		
		warning_suppressor warnings;
		
		try {
			
			// Try to parse headers for this version
			try_load(is, entries, force_codepage);
			
			if(warnings) {
				// Parsed without errors but with warnings - try other versions first
				if(!parsed_without_errors) {
					listed_version = version.value;
					parsed_without_errors = true;
				}
				throw std::exception();
			}
			
			warnings.flush();
			return;
			
		} catch(...) {
			
			is.clear();
			is.seekg(start);
			
			version_constant next_version = version.next();
			
			if(!ambiguous || !next_version) {
				if(version.value != listed_version) {
					// Rewind to a previous version that had better results and report those
					version.value = listed_version;
					warnings.restore();
					try_load(is, entries, force_codepage);
				} else {
					// Otherwise. report results for the current version
					warnings.flush();
					if(!parsed_without_errors) {
						throw;
					}
				}
				return;
			}
			
			// Retry with the next version
			version.value = next_version;
			ambiguous = version.is_ambiguous();
			
		}
		
	}
	
}